

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

void __thiscall network_pimpl::decode(network_pimpl *this,binarydata *data)

{
  long in_RDI;
  int tacq;
  int tsource;
  vector<EventDataType,_std::allocator<EventDataType>_> *in_stack_00000290;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000298;
  int *in_stack_000002a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000002a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000002b0;
  binarydata *in_stack_000002b8;
  vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *in_stack_000002f0;
  int *in_stack_000002f8;
  int *in_stack_00000300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000318;
  int *in_stack_00000320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000328;
  undefined4 local_40;
  undefined4 local_3c;
  
  NetworkDataType::
  deserializedata<std::__cxx11::string,std::__cxx11::string,int,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::vector<EventDataType,std::allocator<EventDataType>>,std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>,int,int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
            (in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,
             in_stack_00000298,in_stack_00000290,in_stack_000002f0,in_stack_000002f8,
             in_stack_00000300,in_stack_00000308,in_stack_00000310,in_stack_00000318,
             in_stack_00000320,in_stack_00000328);
  *(undefined4 *)(in_RDI + 0xb0) = local_3c;
  *(undefined4 *)(in_RDI + 0xb4) = local_40;
  return;
}

Assistant:

void network_pimpl::decode(const binarydata &data){
    int tsource, tacq;
    NetworkDataType::deserializedata(data, endpoint, address, port, clients, events, hfdts,
                                     tsource, tacq, trodes_filename,
                                     hardware_endpoint, hardware_address, hardware_port,
                                     timestamp_endpoint);
    trodes_source = (TrodesSource)tsource;
    trodes_acquisition = (TrodesAcquisition)tacq;
}